

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_test.cpp
# Opt level: O3

void __thiscall
Properties_MingapAfterTransformations_Test::~Properties_MingapAfterTransformations_Test
          (Properties_MingapAfterTransformations_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Properties, MingapAfterTransformations) {
  auto a = Manifold::Sphere(1, 512).Rotate(30, 30, 30);
  auto b =
      Manifold::Sphere(1, 512).Scale({3, 1, 1}).Rotate(0, 90, 45).Translate(
          {3, 0, 0});

  float distance = a.MinGap(b, 1.1);

  ASSERT_NEAR(distance, 1, 0.001);
}